

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TriTriOverlap.h
# Opt level: O2

BOOL CoplanarTriTri(Point *n,Point *v0,Point *v1,Point *v2,Point *u0,Point *u1,Point *u2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  BOOL BVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  if (ABS(n->x) <= ABS(n->y)) {
    uVar10 = (ulong)(ABS(n->z) <= ABS(n->y));
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)(ABS(n->z) < ABS(n->x));
    uVar10 = uVar11;
  }
  uVar9 = (ulong)(uint)((int)uVar11 * 4);
  fVar1 = *(float *)((long)&v1->x + uVar9);
  fVar15 = *(float *)((long)&v0->x + uVar9);
  fVar25 = fVar1 - fVar15;
  uVar12 = (ulong)(uint)(((int)uVar10 + 1) * 4);
  fVar2 = *(float *)((long)&v1->x + uVar12);
  fVar3 = *(float *)((long)&v0->x + uVar12);
  fVar18 = fVar2 - fVar3;
  fVar4 = *(float *)((long)&u0->x + uVar9);
  fVar5 = *(float *)((long)&u1->x + uVar9);
  fVar30 = fVar4 - fVar5;
  fVar6 = *(float *)((long)&u0->x + uVar12);
  fVar7 = *(float *)((long)&u1->x + uVar12);
  fVar14 = fVar6 - fVar7;
  fVar19 = fVar18 * fVar30 - fVar14 * fVar25;
  fVar16 = fVar14 * (fVar15 - fVar4) - (fVar3 - fVar6) * fVar30;
  BVar8 = 1;
  if ((((0.0 < fVar19) && (0.0 <= fVar16)) && (fVar16 <= fVar19)) ||
     (((fVar19 < 0.0 && (fVar16 <= 0.0)) && (fVar19 <= fVar16)))) {
    fVar16 = (fVar3 - fVar6) * fVar25 - (fVar15 - fVar4) * fVar18;
    if (0.0 < fVar19) {
      if ((0.0 <= fVar16) && (fVar16 <= fVar19)) {
        return 1;
      }
    }
    else if ((fVar16 <= 0.0) && (fVar19 <= fVar16)) {
      return 1;
    }
  }
  fVar20 = -fVar25;
  fVar16 = (&u2->x)[uVar11];
  fVar29 = fVar5 - fVar16;
  fVar19 = (&u2->y)[uVar10];
  fVar28 = fVar7 - fVar19;
  fVar21 = fVar18 * fVar29 + fVar28 * fVar20;
  fVar17 = fVar28 * (fVar15 - fVar5) - (fVar3 - fVar7) * fVar29;
  if ((((0.0 < fVar21) && (0.0 <= fVar17)) && (fVar17 <= fVar21)) ||
     (((fVar21 < 0.0 && (fVar17 <= 0.0)) && (fVar21 <= fVar17)))) {
    fVar17 = (fVar3 - fVar7) * fVar25 - (fVar15 - fVar5) * fVar18;
    if (0.0 < fVar21) {
      if ((0.0 <= fVar17) && (fVar17 <= fVar21)) {
        return 1;
      }
    }
    else if ((fVar17 <= 0.0) && (fVar21 <= fVar17)) {
      return 1;
    }
  }
  fVar17 = fVar16 - fVar4;
  fVar27 = fVar19 - fVar6;
  fVar26 = fVar18 * fVar17 + fVar27 * fVar20;
  fVar21 = fVar27 * (fVar15 - fVar16) - (fVar3 - fVar19) * fVar17;
  if ((((0.0 < fVar26) && (0.0 <= fVar21)) && (fVar21 <= fVar26)) ||
     (((fVar26 < 0.0 && (fVar21 <= 0.0)) && (fVar26 <= fVar21)))) {
    fVar21 = (fVar3 - fVar19) * fVar25 - (fVar15 - fVar16) * fVar18;
    if (0.0 < fVar26) {
      if ((0.0 <= fVar21) && (fVar21 <= fVar26)) {
        return 1;
      }
    }
    else if ((fVar21 <= 0.0) && (fVar26 <= fVar21)) {
      return 1;
    }
  }
  fVar21 = (&v2->x)[uVar11];
  fVar32 = fVar21 - fVar1;
  fVar26 = (&v2->y)[uVar10];
  fVar22 = fVar26 - fVar2;
  fVar23 = fVar22 * fVar30 - fVar14 * fVar32;
  fVar13 = fVar14 * (fVar1 - fVar4) + (fVar2 - fVar6) * -fVar30;
  if ((((0.0 < fVar23) && (0.0 <= fVar13)) && (fVar13 <= fVar23)) ||
     (((fVar23 < 0.0 && (fVar13 <= 0.0)) && (fVar23 <= fVar13)))) {
    fVar13 = (fVar2 - fVar6) * fVar32 - (fVar1 - fVar4) * fVar22;
    if (0.0 < fVar23) {
      if ((0.0 <= fVar13) && (fVar13 <= fVar23)) {
        return 1;
      }
    }
    else if ((fVar13 <= 0.0) && (fVar23 <= fVar13)) {
      return 1;
    }
  }
  fVar23 = -fVar32;
  fVar24 = fVar22 * fVar29 + fVar28 * fVar23;
  fVar13 = fVar28 * (fVar1 - fVar5) + (fVar2 - fVar7) * -fVar29;
  if ((((0.0 < fVar24) && (0.0 <= fVar13)) && (fVar13 <= fVar24)) ||
     (((fVar24 < 0.0 && (fVar13 <= 0.0)) && (fVar24 <= fVar13)))) {
    fVar13 = (fVar2 - fVar7) * fVar32 - (fVar1 - fVar5) * fVar22;
    if (0.0 < fVar24) {
      if ((0.0 <= fVar13) && (fVar13 <= fVar24)) {
        return 1;
      }
    }
    else if ((fVar13 <= 0.0) && (fVar24 <= fVar13)) {
      return 1;
    }
  }
  fVar24 = fVar22 * fVar17 + fVar27 * fVar23;
  fVar13 = fVar27 * (fVar1 - fVar16) + (fVar2 - fVar19) * -fVar17;
  if ((((0.0 < fVar24) && (0.0 <= fVar13)) && (fVar13 <= fVar24)) ||
     (((fVar24 < 0.0 && (fVar13 <= 0.0)) && (fVar24 <= fVar13)))) {
    fVar13 = (fVar2 - fVar19) * fVar32 - (fVar1 - fVar16) * fVar22;
    if (0.0 < fVar24) {
      if ((0.0 <= fVar13) && (fVar13 <= fVar24)) {
        return 1;
      }
    }
    else if ((fVar13 <= 0.0) && (fVar24 <= fVar13)) {
      return 1;
    }
  }
  fVar24 = fVar15 - fVar21;
  fVar13 = fVar3 - fVar26;
  fVar31 = fVar30 * fVar13 - fVar14 * fVar24;
  fVar14 = fVar14 * (fVar21 - fVar4) + -fVar30 * (fVar26 - fVar6);
  if ((((0.0 < fVar31) && (0.0 <= fVar14)) && (fVar14 <= fVar31)) ||
     (((fVar31 < 0.0 && (fVar14 <= 0.0)) && (fVar31 <= fVar14)))) {
    fVar14 = (fVar26 - fVar6) * fVar24 - (fVar21 - fVar4) * fVar13;
    if (0.0 < fVar31) {
      if ((0.0 <= fVar14) && (fVar14 <= fVar31)) {
        return 1;
      }
    }
    else if ((fVar14 <= 0.0) && (fVar31 <= fVar14)) {
      return 1;
    }
  }
  fVar14 = -fVar24;
  fVar31 = fVar29 * fVar13 + fVar28 * fVar14;
  fVar30 = fVar28 * (fVar21 - fVar5) + -fVar29 * (fVar26 - fVar7);
  if ((((0.0 < fVar31) && (0.0 <= fVar30)) && (fVar30 <= fVar31)) ||
     (((fVar31 < 0.0 && (fVar30 <= 0.0)) && (fVar31 <= fVar30)))) {
    fVar30 = (fVar26 - fVar7) * fVar24 - (fVar21 - fVar5) * fVar13;
    if (0.0 < fVar31) {
      if ((0.0 <= fVar30) && (fVar30 <= fVar31)) {
        return 1;
      }
    }
    else if ((fVar30 <= 0.0) && (fVar31 <= fVar30)) {
      return 1;
    }
  }
  fVar28 = fVar17 * fVar13 + fVar27 * fVar14;
  fVar30 = fVar27 * (fVar21 - fVar16) + -fVar17 * (fVar26 - fVar19);
  if ((((0.0 < fVar28) && (0.0 <= fVar30)) && (fVar30 <= fVar28)) ||
     (((fVar28 < 0.0 && (fVar30 <= 0.0)) && (fVar28 <= fVar30)))) {
    fVar30 = (fVar26 - fVar19) * fVar24 - (fVar21 - fVar16) * fVar13;
    if (0.0 < fVar28) {
      if ((0.0 <= fVar30) && (fVar30 <= fVar28)) {
        return 1;
      }
    }
    else if ((fVar30 <= 0.0) && (fVar28 <= fVar30)) {
      return 1;
    }
  }
  fVar30 = (fVar15 * (fVar7 - fVar6) - fVar3 * (fVar5 - fVar4)) +
           (fVar6 * (fVar5 - fVar4) - fVar4 * (fVar7 - fVar6));
  if (((((fVar15 * (fVar19 - fVar7) - fVar3 * (fVar16 - fVar5)) +
        (fVar7 * (fVar16 - fVar5) - fVar5 * (fVar19 - fVar7))) * fVar30 <= 0.0) ||
      (fVar30 * (fVar16 * -(fVar6 - fVar19) + (fVar4 - fVar16) * fVar19 +
                fVar15 * (fVar6 - fVar19) + -(fVar4 - fVar16) * fVar3) <= 0.0)) &&
     ((fVar15 = fVar15 * -fVar18 + fVar3 * fVar25 + fVar4 * fVar18 + fVar20 * fVar6,
      (fVar4 * fVar22 + fVar23 * fVar6 + fVar1 * -fVar22 + fVar32 * fVar2) * fVar15 <= 0.0 ||
      (fVar15 * (fVar21 * -fVar13 + fVar24 * fVar26 + fVar4 * fVar13 + fVar14 * fVar6) <= 0.0)))) {
    BVar8 = 0;
  }
  return BVar8;
}

Assistant:

BOOL CoplanarTriTri(const Point& n, const Point& v0, const Point& v1, const Point& v2, const Point& u0, const Point& u1, const Point& u2)
{
	float A[3];
	short i0,i1;
	/* first project onto an axis-aligned plane, that maximizes the area */
	/* of the triangles, compute indices: i0,i1. */
	A[0] = fabsf(n[0]);
	A[1] = fabsf(n[1]);
	A[2] = fabsf(n[2]);
	if(A[0]>A[1])
	{
		if(A[0]>A[2])
		{
			i0=1;      /* A[0] is greatest */
			i1=2;
		}
		else
		{
			i0=0;      /* A[2] is greatest */
			i1=1;
		}
	}
	else   /* A[0]<=A[1] */
	{
		if(A[2]>A[1])
		{
			i0=0;      /* A[2] is greatest */
			i1=1;
		}
		else
		{
			i0=0;      /* A[1] is greatest */
			i1=2;
		}
	}

	/* test all edges of triangle 1 against the edges of triangle 2 */
	EDGE_AGAINST_TRI_EDGES(v0, v1, u0, u1, u2);
	EDGE_AGAINST_TRI_EDGES(v1, v2, u0, u1, u2);
	EDGE_AGAINST_TRI_EDGES(v2, v0, u0, u1, u2);

	/* finally, test if tri1 is totally contained in tri2 or vice versa */
	POINT_IN_TRI(v0, u0, u1, u2);
	POINT_IN_TRI(u0, v0, v1, v2);

	return FALSE;
}